

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O2

void __thiscall
pstore::
basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
::basic_rotating_log
          (basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
           *this,string *base_name,streamoff max_size,uint num_backups,
          mock_string_stream_traits *stream_traits,mock_file_system_traits *fs_traits)

{
  streamoff sVar1;
  
  basic_logger::basic_logger(&this->super_basic_logger);
  (this->super_basic_logger).super_logger._vptr_logger =
       (_func_int **)&PTR__basic_rotating_log_00259c58;
  sVar1 = 0;
  if (0 < max_size) {
    sVar1 = max_size;
  }
  this->max_size_ = sVar1;
  std::__cxx11::string::string((string *)&this->base_name_,(string *)base_name);
  this->num_backups_ = num_backups;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stream_);
  this->is_open_ = false;
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  ::FunctionMocker(&(this->stream_traits_).gmock03_open_44);
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&(this->stream_traits_).gmock01_close_45);
  testing::internal::
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&(this->stream_traits_).gmock01_clear_46);
  testing::internal::
  FunctionMocker<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&(this->file_system_traits_).gmock01_exists_32);
  testing::internal::
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&(this->file_system_traits_).gmock01_unlink_33);
  testing::internal::
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&(this->file_system_traits_).gmock02_rename_34);
  return;
}

Assistant:

basic_rotating_log<StreamTraits, FileSystemTraits>::basic_rotating_log (
        std::string base_name, std::streamoff const max_size, unsigned const num_backups,
        StreamTraits const & stream_traits, FileSystemTraits const & fs_traits)
            : max_size_ (std::max (max_size, std::streamoff{0}))
            , base_name_{std::move (base_name)}
            , num_backups_ (num_backups)
            , stream_ ()
            , stream_traits_ (stream_traits)
            , file_system_traits_ (fs_traits) {}